

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::PolySort(OutRec *or1,OutRec *or2)

{
  int local_28;
  int result;
  int i2;
  int i1;
  OutRec *or2_local;
  OutRec *or1_local;
  
  if (or1 == or2) {
    or1_local._7_1_ = false;
  }
  else if ((or1->pts == (OutPt *)0x0) || (or2->pts == (OutPt *)0x0)) {
    if (or1->pts == or2->pts) {
      or1_local._7_1_ = false;
    }
    else {
      or1_local._7_1_ = or1->pts != (OutPt *)0x0;
    }
  }
  else {
    if ((or1->isHole & 1U) == 0) {
      result = or1->idx;
    }
    else {
      result = or1->FirstLeft->idx;
    }
    if ((or2->isHole & 1U) == 0) {
      local_28 = or2->idx;
    }
    else {
      local_28 = or2->FirstLeft->idx;
    }
    if ((result == local_28) && ((or1->isHole & 1U) != (or2->isHole & 1U))) {
      or1_local._7_1_ = (bool)((or1->isHole & 1U) - 1 & 1);
    }
    else {
      or1_local._7_1_ = result - local_28 < 0;
    }
  }
  return or1_local._7_1_;
}

Assistant:

bool PolySort(OutRec *or1, OutRec *or2)
{
  if (or1 == or2) return false;
  if (!or1->pts || !or2->pts)
  {
    if (or1->pts != or2->pts)
    {
      return or1->pts ? true : false;
    }
    else return false;
  }
  int i1, i2;
  if (or1->isHole)
    i1 = or1->FirstLeft->idx; else
    i1 = or1->idx;
  if (or2->isHole)
    i2 = or2->FirstLeft->idx; else
    i2 = or2->idx;
  int result = i1 - i2;
  if (result == 0 && (or1->isHole != or2->isHole))
  {
    return or1->isHole ? false : true;
  }
  else return result < 0;
}